

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

void __thiscall QFutureInterfaceBase::reportFinished(QFutureInterfaceBase *this)

{
  uint uVar1;
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  QFutureInterfaceBasePrivate *pQVar2;
  uint uVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QFutureCallOutEvent local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar5 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar5) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar5) goto LAB_001eeb35;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001eeb35:
  pQVar2 = this->d;
  if (((pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 4U) == 0) {
    uVar3 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i;
    do {
      LOCK();
      uVar1 = (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i;
      bVar5 = uVar3 == uVar1;
      if (bVar5) {
        (pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i = uVar3 & 0xfffffffa | 4;
        uVar1 = uVar3;
      }
      uVar3 = uVar1;
      UNLOCK();
    } while (!bVar5);
    QWaitCondition::wakeAll(&this->d->waitCondition);
    pQVar2 = this->d;
    QEvent::QEvent(&local_60.super_QEvent,FutureCallOut);
    local_60.super_QEvent._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_0069e640;
    local_60.callOutType = Finished;
    local_60.index1 = -1;
    local_60.index2 = -1;
    local_60.text.d.size = 0;
    local_60.text.d.d = (Data *)0x0;
    local_60.text.d.ptr = (char16_t *)0x0;
    if ((pQVar2->outputConnections).d.size != 0) {
      uVar4 = 0;
      do {
        (*(pQVar2->outputConnections).d.ptr[uVar4]->_vptr_QFutureCallOutInterface[2])();
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(pQVar2->outputConnections).d.size);
    }
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_60);
  }
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::reportFinished()
{
    QMutexLocker locker(&d->m_mutex);
    if (!isFinished()) {
        switch_from_to(d->state, Running, Finished);
        d->waitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Finished));
    }
}